

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseException.h
# Opt level: O0

string * __thiscall
AutoArgParse::MissingMandatoryArgException::makeErrorMessage_abi_cxx11_
          (string *__return_storage_ptr__,MissingMandatoryArgException *this,FlagStore *flagStore)

{
  ostringstream local_190 [8];
  ostringstream os;
  FlagStore *flagStore_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,"Missing mandatory argument(s).  Valid option(s) are: ");
  printUnParsed((ostringstream *)local_190,
                (ArgVector *)&this[2].super_ParseException.errorMessage.field_2);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

static std::string makeErrorMessage(const FlagStore& flagStore) {
        std::ostringstream os;
        os << "Missing mandatory argument(s).  Valid option(s) are: ";
        printUnParsed(os, flagStore.args);
        return os.str();
    }